

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O2

Fxu_Single * Fxu_HeapSingleGetMax(Fxu_HeapSingle *p)

{
  int iVar1;
  Fxu_Single **ppFVar2;
  Fxu_Single *pSingle;
  Fxu_Single *pFVar3;
  
  iVar1 = p->nItems;
  if ((long)iVar1 == 0) {
    pFVar3 = (Fxu_Single *)0x0;
  }
  else {
    ppFVar2 = p->pTree;
    pFVar3 = ppFVar2[1];
    pFVar3->HNum = 0;
    p->nItems = iVar1 + -1;
    ppFVar2[1] = ppFVar2[iVar1];
    pSingle = p->pTree[1];
    pSingle->HNum = 1;
    Fxu_HeapSingleMoveDn(p,pSingle);
  }
  return pFVar3;
}

Assistant:

Fxu_Single * Fxu_HeapSingleGetMax( Fxu_HeapSingle * p )
{
    Fxu_Single * pSingle;
    if ( p->nItems == 0 )
        return NULL;
    // prepare the return value
    pSingle = p->pTree[1];
    pSingle->HNum = 0;
    // put the last entry on top
    // decrement the number of entries
    p->pTree[1] = p->pTree[p->nItems--];
    p->pTree[1]->HNum = 1;
    // move the top entry down if necessary
    Fxu_HeapSingleMoveDn( p, p->pTree[1] );
    return pSingle;     
}